

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validate.cc
# Opt level: O1

int ProgramMain(int argc,char **argv)

{
  _Alloc_hider this;
  ulong uVar1;
  Result RVar2;
  char *pcVar3;
  _Any_data *callback;
  uint uVar4;
  string_view filename;
  ReadBinaryOptions options;
  Errors errors;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  ValidateOptions options_1;
  OptionParser parser;
  _Any_data local_418;
  _Head_base<0UL,_wabt::FileStream_*,_false> local_408;
  undefined8 local_400;
  Errors local_3f8;
  void *local_3d8;
  long lStack_3d0;
  undefined8 local_3c8;
  _Any_data local_3b8;
  code *local_3a8;
  code *local_3a0;
  undefined1 local_398 [92];
  Index IStack_33c;
  Index IStack_338;
  undefined8 uStack_334;
  undefined1 local_328 [16];
  pointer local_318;
  __node_base_ptr *local_220;
  size_type local_218;
  __node_base local_210;
  size_type sStack_208;
  float local_200;
  size_t local_1f8;
  __node_base_ptr p_Stack_1f0;
  __node_base_ptr *local_1e8;
  size_type local_1e0;
  __node_base local_1d8;
  size_type sStack_1d0;
  float local_1c8;
  size_t local_1c0;
  __node_base_ptr p_Stack_1b8;
  __node_base_ptr *local_1b0;
  size_type local_1a8;
  __node_base local_1a0;
  size_type sStack_198;
  float local_190;
  size_t local_188;
  __node_base_ptr p_Stack_180;
  __node_base_ptr *local_178;
  size_type local_170;
  __node_base local_168;
  size_type sStack_160;
  float local_158;
  size_t local_150;
  __node_base_ptr p_Stack_148;
  __node_base_ptr *local_140;
  size_type local_138;
  __node_base local_130;
  size_type sStack_128;
  float local_120;
  size_t local_118;
  __node_base_ptr p_Stack_110;
  __node_base_ptr *local_108;
  size_type local_100;
  __node_base local_f8;
  size_type sStack_f0;
  float local_e8;
  size_t local_e0;
  __node_base_ptr p_Stack_d8;
  __node_base_ptr *local_d0;
  size_type local_c8;
  __node_base local_c0;
  size_type sStack_b8;
  float local_b0;
  size_t local_a8;
  __node_base_ptr p_Stack_a0;
  __node_base_ptr *local_98;
  size_type local_90;
  __node_base local_88;
  size_type sStack_80;
  float local_78;
  size_t local_70;
  __node_base_ptr p_Stack_68;
  __node_base_ptr *local_60;
  size_type local_58;
  __node_base local_50;
  size_type sStack_48;
  float local_40;
  size_t local_38;
  __node_base_ptr ap_Stack_30 [2];
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_398,"wasm-validate",
             "  Read a file in the WebAssembly binary format, and validate it.\n\nexamples:\n  # validate binary file test.wasm\n  $ wasm-validate test.wasm\n"
            );
  local_418._M_unused._M_object = (void *)0x0;
  local_418._8_8_ = 0;
  local_400 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-validate.cc:51:72)>
              ::_M_invoke;
  local_408._M_head_impl =
       (FileStream *)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-validate.cc:51:72)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_398,'v',"verbose","Use multiple times for more info",
             (NullCallback *)&local_418);
  if (local_408._M_head_impl != (FileStream *)0x0) {
    (*(code *)local_408._M_head_impl)(&local_418,&local_418,3);
  }
  wabt::Features::AddOptions(&s_features,(OptionParser *)local_398);
  local_418._M_unused._M_object = (void *)0x0;
  local_418._8_8_ = 0;
  local_400 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-validate.cc:57:20)>
              ::_M_invoke;
  local_408._M_head_impl =
       (FileStream *)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-validate.cc:57:20)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_398,"no-debug-names","Ignore debug names in the binary file",
             (NullCallback *)&local_418);
  if (local_408._M_head_impl != (FileStream *)0x0) {
    (*(code *)local_408._M_head_impl)(&local_418,&local_418,3);
  }
  local_418._M_unused._M_object = (void *)0x0;
  local_418._8_8_ = 0;
  local_400 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-validate.cc:60:20)>
              ::_M_invoke;
  local_408._M_head_impl =
       (FileStream *)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-validate.cc:60:20)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_398,"ignore-custom-section-errors",
             "Ignore errors in custom sections",(NullCallback *)&local_418);
  if (local_408._M_head_impl != (FileStream *)0x0) {
    (*(code *)local_408._M_head_impl)(&local_418,&local_418,3);
  }
  local_408._M_head_impl = (FileStream *)0x656d616e656c6966;
  local_418._8_8_ = 8;
  local_400 = (code *)((ulong)local_400 & 0xffffffffffffff00);
  callback = &local_3b8;
  local_3b8._M_unused._M_object = (code **)0x0;
  local_3b8._8_8_ = 0;
  local_3a0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-validate.cc:62:22)>
              ::_M_invoke;
  local_3a8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-validate.cc:62:22)>
              ::_M_manager;
  local_418._M_unused._M_object = &local_408;
  wabt::OptionParser::AddArgument
            ((OptionParser *)local_398,(string *)&local_418,One,(Callback *)callback);
  if (local_3a8 != (code *)0x0) {
    (*local_3a8)(&local_3b8,&local_3b8,3);
  }
  if ((_Head_base<0UL,_wabt::FileStream_*,_false> *)local_418._M_unused._0_8_ != &local_408) {
    operator_delete(local_418._M_unused._M_object);
  }
  wabt::OptionParser::Parse((OptionParser *)local_398,argc,argv);
  if (local_318 != (pointer)0x0) {
    (*(code *)local_318)(local_328,local_328,3);
  }
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            ((vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> *)
             (local_398 + 0x58));
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
             (local_398 + 0x40));
  if ((undefined1 *)local_398._32_8_ != local_398 + 0x30) {
    operator_delete((void *)local_398._32_8_);
  }
  if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
    operator_delete((void *)local_398._0_8_);
  }
  this._M_p = s_infile_abi_cxx11_._M_dataplus._M_p;
  local_3d8 = (void *)0x0;
  lStack_3d0 = 0;
  local_3c8 = 0;
  pcVar3 = (char *)strlen(s_infile_abi_cxx11_._M_dataplus._M_p);
  filename.size_ = (size_type)&local_3d8;
  filename.data_ = pcVar3;
  RVar2 = wabt::ReadFile((wabt *)this._M_p,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  uVar4 = 1;
  if (RVar2.enum_ == Ok) {
    local_3f8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3f8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3f8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_398._16_4_ = 0;
    local_398._20_8_ = 0;
    local_398._0_8_ = (pointer)0x0;
    local_398._8_4_ = 0;
    local_398._12_4_ = 0;
    local_398._40_8_ = 0;
    local_398[0x30] = '\0';
    local_398._64_8_ = (pointer)0x0;
    local_398._72_8_ = (pointer)0x0;
    local_398._80_8_ = (pointer)0x0;
    local_398._88_4_ = 0;
    IStack_33c = 0;
    IStack_338 = 0;
    uStack_334 = 0;
    local_398._32_8_ = local_398 + 0x30;
    memset(local_328,0,0x108);
    uVar1 = (ulong)local_400;
    local_218 = 1;
    local_210._M_nxt = (_Hash_node_base *)0x0;
    sStack_208 = 0;
    local_200 = 1.0;
    local_1f8 = 0;
    p_Stack_1f0 = (__node_base_ptr)0x0;
    local_1e8 = &p_Stack_1b8;
    local_1e0 = 1;
    local_1d8._M_nxt = (_Hash_node_base *)0x0;
    sStack_1d0 = 0;
    local_1c8 = 1.0;
    local_1c0 = 0;
    p_Stack_1b8 = (__node_base_ptr)0x0;
    local_1b0 = &p_Stack_180;
    local_1a8 = 1;
    local_1a0._M_nxt = (_Hash_node_base *)0x0;
    sStack_198 = 0;
    local_190 = 1.0;
    local_188 = 0;
    p_Stack_180 = (__node_base_ptr)0x0;
    local_178 = &p_Stack_148;
    local_170 = 1;
    local_168._M_nxt = (_Hash_node_base *)0x0;
    sStack_160 = 0;
    local_158 = 1.0;
    local_150 = 0;
    p_Stack_148 = (__node_base_ptr)0x0;
    local_140 = &p_Stack_110;
    local_138 = 1;
    local_130._M_nxt = (_Hash_node_base *)0x0;
    sStack_128 = 0;
    local_120 = 1.0;
    local_118 = 0;
    p_Stack_110 = (__node_base_ptr)0x0;
    local_108 = &p_Stack_d8;
    local_100 = 1;
    local_f8._M_nxt = (_Hash_node_base *)0x0;
    sStack_f0 = 0;
    local_e8 = 1.0;
    local_e0 = 0;
    p_Stack_d8 = (__node_base_ptr)0x0;
    local_d0 = &p_Stack_a0;
    local_c8 = 1;
    local_c0._M_nxt = (_Hash_node_base *)0x0;
    sStack_b8 = 0;
    local_b0 = 1.0;
    local_a8 = 0;
    p_Stack_a0 = (__node_base_ptr)0x0;
    local_98 = &p_Stack_68;
    local_90 = 1;
    local_88._M_nxt = (_Hash_node_base *)0x0;
    sStack_80 = 0;
    local_78 = 1.0;
    local_70 = 0;
    p_Stack_68 = (__node_base_ptr)0x0;
    local_60 = ap_Stack_30;
    local_58 = 1;
    local_50._M_nxt = (_Hash_node_base *)0x0;
    sStack_48 = 0;
    local_40 = 1.0;
    local_38 = 0;
    ap_Stack_30[0] = (__node_base_ptr)0x0;
    local_418._M_unused._M_object = (void *)s_features._0_8_;
    local_418._M_pod_data[8] = s_features.bulk_memory_enabled_;
    local_418._M_pod_data[9] = s_features.reference_types_enabled_;
    local_418._M_pod_data[10] = s_features.annotations_enabled_;
    local_418._M_pod_data[0xb] = s_features.gc_enabled_;
    local_408._M_head_impl =
         (FileStream *)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    local_400._0_2_ = CONCAT11(1,s_read_debug_names ^ 1);
    local_400._3_5_ = SUB85(uVar1,3);
    local_400 = (code *)(CONCAT53(local_400._3_5_,
                                  CONCAT12(s_fail_on_custom_section_error,(undefined2)local_400)) ^
                        0x10000);
    local_220 = &p_Stack_1f0;
    RVar2 = wabt::ReadBinaryIr(s_infile_abi_cxx11_._M_dataplus._M_p,local_3d8,
                               lStack_3d0 - (long)local_3d8,(ReadBinaryOptions *)&local_418,
                               &local_3f8,(Module *)local_398);
    uVar4 = 1;
    if (RVar2.enum_ == Ok) {
      local_3b8._M_pod_data[8] = s_features.bulk_memory_enabled_;
      local_3b8._M_pod_data[9] = s_features.reference_types_enabled_;
      local_3b8._M_pod_data[10] = s_features.annotations_enabled_;
      local_3b8._M_pod_data[0xb] = s_features.gc_enabled_;
      local_3b8._M_unused._M_object = (void *)s_features._0_8_;
      RVar2 = wabt::ValidateModule((Module *)local_398,&local_3f8,(ValidateOptions *)&local_3b8);
      uVar4 = (uint)(RVar2.enum_ != Ok);
    }
    local_3b8._8_8_ = 0;
    local_3a8 = (code *)((ulong)local_3a8 & 0xffffffffffffff00);
    local_3b8._M_unused._M_object = &local_3a8;
    wabt::FormatErrorsToFile
              (&local_3f8,Binary,(LexerSourceLineFinder *)0x0,_stderr,(string *)&local_3b8,Never,
               0x50);
    if ((code **)local_3b8._M_unused._0_8_ != &local_3a8) {
      operator_delete(local_3b8._M_unused._M_object);
    }
    wabt::Module::~Module((Module *)local_398);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_3f8);
  }
  if (local_3d8 != (void *)0x0) {
    operator_delete(local_3d8);
  }
  return uVar4;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    ReadBinaryOptions options(s_features, s_log_stream.get(),
                              s_read_debug_names, kStopOnFirstError,
                              s_fail_on_custom_section_error);
    result = ReadBinaryIr(s_infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      ValidateOptions options(s_features);
      result = ValidateModule(&module, &errors, options);
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}